

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.hxx
# Opt level: O2

ptr<snapshot_sync_ctx> __thiscall nuraft::peer::get_snapshot_sync_ctx(peer *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  ptr<snapshot_sync_ctx> pVar1;
  
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(in_RSI + 0xb0))->__data);
  std::__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0xa0))
  ;
  pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0xb0));
  pVar1.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<snapshot_sync_ctx>)
         pVar1.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot_sync_ctx> get_snapshot_sync_ctx() const {
        std::lock_guard<std::mutex> l(snp_sync_ctx_lock_);
        return snp_sync_ctx_;
    }